

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Spill<wabt::(anonymous_namespace)::CWriter::Write(wabt::intrusive_list<wabt::Expr>const&)::__0>
          (CWriter *this,TypeVector *types,anon_class_8_1_f948b21d *src)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  const_reference pvVar4;
  StackVar SVar5;
  Newline local_71;
  StackVar local_70;
  StackVar local_5c;
  Type local_50;
  uint local_48;
  Newline local_41;
  Index i;
  Enum EStack_3c;
  Index local_38;
  StackVar local_2c;
  __0 *local_20;
  anon_class_8_1_f948b21d *src_local;
  TypeVector *types_local;
  CWriter *this_local;
  
  local_20 = (__0 *)src;
  src_local = (anon_class_8_1_f948b21d *)types;
  types_local = (TypeVector *)this;
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  if (sVar2 != 0) {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)src_local);
    if (sVar2 == 1) {
      SVar5 = Write(wabt::intrusive_list<wabt::Expr>const&)::$_0::operator()(local_20,0);
      _i = SVar5._0_8_;
      local_2c.index = i;
      local_2c.type.enum_ = EStack_3c;
      local_38 = SVar5.type.type_index_;
      local_2c.type.type_index_ = local_38;
      _i = SVar5;
      Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                (this,(char (*) [7])0x37d5be,&local_2c,(char (*) [2])0x37ca1e,&local_41);
    }
    else {
      local_48 = 0;
      while( true ) {
        uVar3 = (ulong)local_48;
        sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                          ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)src_local);
        if (sVar2 <= uVar3) break;
        pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::at
                           ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)src_local,
                            (ulong)local_48);
        local_50.enum_ = pvVar4->enum_;
        local_50.type_index_ = pvVar4->type_index_;
        cVar1 = anon_unknown_0::CWriter::MangleType(local_50);
        anon_unknown_0::CWriter::Writef
                  ((CWriter *)this,"tmp.%c%d = ",(ulong)(uint)(int)cVar1,(ulong)local_48);
        SVar5 = Write(wabt::intrusive_list<wabt::Expr>const&)::$_0::operator()(local_20,local_48);
        local_70._0_8_ = SVar5._0_8_;
        local_5c.index = local_70.index;
        local_5c.type.enum_ = local_70.type.enum_;
        local_70.type.type_index_ = SVar5.type.type_index_;
        local_5c.type.type_index_ = local_70.type.type_index_;
        local_70 = SVar5;
        Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  (this,&local_5c,(char (*) [2])0x37ca1e,&local_71);
        local_48 = local_48 + 1;
      }
    }
    return;
  }
  __assert_fail("types.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                ,0xba2,
                "void wabt::(anonymous namespace)::CWriter::Spill(const TypeVector &, const sources &) [sources = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:4249:17)]"
               );
}

Assistant:

void CWriter::Spill(const TypeVector& types, const sources& src) {
  assert(types.size() > 0);

  if (types.size() == 1) {
    Write("tmp = ", src(0), ";", Newline());
    return;
  }

  for (Index i = 0; i < types.size(); ++i) {
    Writef("tmp.%c%d = ", MangleType(types.at(i)), i);
    Write(src(i), ";", Newline());
  }
}